

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_shuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  char *pcVar1;
  char *local_40;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  int *status_local;
  LONGLONG length_local;
  char *heap_local;
  
  __src = calloc(1,length << 3);
  local_40 = heap;
  for (ptr = (char *)0x0; (long)ptr < length; ptr = ptr + 1) {
    *(char *)((long)__src + (long)ptr) = *local_40;
    pcVar1 = (char *)((long)__src + (long)ptr) + length;
    *pcVar1 = local_40[1];
    pcVar1 = pcVar1 + length;
    *pcVar1 = local_40[2];
    pcVar1 = pcVar1 + length;
    *pcVar1 = local_40[3];
    pcVar1 = pcVar1 + length;
    *pcVar1 = local_40[4];
    pcVar1 = pcVar1 + length;
    *pcVar1 = local_40[5];
    pcVar1[length] = local_40[6];
    (pcVar1 + length)[length] = local_40[7];
    local_40 = local_40 + 8;
  }
  memcpy(heap,__src,length << 3);
  free(__src);
  return *status;
}

Assistant:

static int fits_shuffle_8bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 8-byte integers or doubles in the heap */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = calloc(1, (size_t) (length * 8));
    heapptr = heap;
    
/* for some bizarre reason this loop fails to compile under OpenSolaris using
   the proprietary SunStudioExpress C compiler;  use the following equivalent
   loop instead.
   
    cptr = ptr;

    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       *(cptr + (length * 4)) = *heapptr;
       heapptr++;
       *(cptr + (length * 5)) = *heapptr;
       heapptr++;
       *(cptr + (length * 6)) = *heapptr;
       heapptr++;
       *(cptr + (length * 7)) = *heapptr;
       heapptr++;
       cptr++;
     }
*/
     for (ii = 0; ii < length; ii++) {
        cptr = ptr + ii;

        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
     }
        
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
 
    return(*status);
}